

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.h
# Opt level: O2

bool __thiscall fast_float::bigint::pow5(bigint *this,uint32_t exp)

{
  bool bVar1;
  uint64_t *puVar2;
  limb *plVar3;
  limb_span y;
  
  puVar2 = pow5_tables<void>::small_power_of_5;
  plVar3 = pow5_tables<void>::small_power_of_5 + exp;
  for (; 0x86 < exp; exp = exp - 0x87) {
    y.length = (size_t)puVar2;
    y.ptr = (unsigned_long *)0x5;
    bVar1 = large_mul<(unsigned_short)62>
                      ((fast_float *)this,
                       (stackvec<(unsigned_short)62> *)pow5_tables<void>::large_power_of_5,y);
    if (!bVar1) goto LAB_00129bbe;
    plVar3 = plVar3 + -0x87;
  }
  for (; 0x1a < exp; exp = exp - 0x1b) {
    bVar1 = small_mul<(unsigned_short)62>(&this->vec,0x6765c793fa10079d);
    if (!bVar1) goto LAB_00129bbe;
    plVar3 = plVar3 + -0x1b;
  }
  if ((exp == 0) || (bVar1 = small_mul<(unsigned_short)62>(&this->vec,*plVar3), bVar1)) {
    bVar1 = true;
  }
  else {
LAB_00129bbe:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

FASTFLOAT_CONSTEXPR20 bool pow5(uint32_t exp) noexcept {
    // multiply by a power of 5
    size_t large_length = sizeof(large_power_of_5) / sizeof(limb);
    limb_span large = limb_span(large_power_of_5, large_length);
    while (exp >= large_step) {
      FASTFLOAT_TRY(large_mul(vec, large));
      exp -= large_step;
    }
#ifdef FASTFLOAT_64BIT_LIMB
    uint32_t small_step = 27;
    limb max_native = 7450580596923828125UL;
#else
    uint32_t small_step = 13;
    limb max_native = 1220703125U;
#endif
    while (exp >= small_step) {
      FASTFLOAT_TRY(small_mul(vec, max_native));
      exp -= small_step;
    }
    if (exp != 0) {
      // Work around clang bug https://godbolt.org/z/zedh7rrhc
      // This is similar to https://github.com/llvm/llvm-project/issues/47746,
      // except the workaround described there don't work here
      FASTFLOAT_TRY(
        small_mul(vec, limb(((void)small_power_of_5[0], small_power_of_5[exp])))
      );
    }

    return true;
  }